

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigPhase.c
# Opt level: O2

Abc_Cex_t * Saig_PhaseTranslateCex(Aig_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  uint uVar2;
  Abc_Cex_t *pAVar3;
  int iVar4;
  int nFrames;
  int iVar5;
  int iVar6;
  
  iVar4 = p->nTruePis;
  if (pCex->nPis % iVar4 == 0) {
    iVar6 = (pCex->nPis / iVar4) * pCex->iFrame;
    iVar1 = pCex->iPo / p->nTruePos;
    nFrames = iVar1 + iVar6 + 1;
    pAVar3 = Abc_CexAlloc(p->nRegs,iVar4,nFrames);
    iVar4 = pAVar3->nRegs;
    iVar5 = pAVar3->nBits;
    if (iVar5 != nFrames * pAVar3->nPis + iVar4) {
      __assert_fail("pNew->nBits == pNew->nPis * (iFrame + 1) + pNew->nRegs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                    ,0x427,"Abc_Cex_t *Saig_PhaseTranslateCex(Aig_Man_t *, Abc_Cex_t *)");
    }
    pAVar3->iFrame = iVar1 + iVar6;
    pAVar3->iPo = pCex->iPo % p->nTruePos;
    uVar2 = pCex->nRegs;
    for (; iVar4 < iVar5; iVar4 = iVar4 + 1) {
      if (((uint)(&pCex[1].iPo)[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0) {
        (&pAVar3[1].iPo)[iVar4 >> 5] = (&pAVar3[1].iPo)[iVar4 >> 5] | 1 << ((byte)iVar4 & 0x1f);
        iVar5 = pAVar3->nBits;
      }
      uVar2 = uVar2 + 1;
    }
    if (pCex->nBits < (int)uVar2) {
      __assert_fail("i <= pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigPhase.c"
                    ,0x42f,"Abc_Cex_t *Saig_PhaseTranslateCex(Aig_Man_t *, Abc_Cex_t *)");
    }
  }
  else {
    puts("The PI count in the AIG and in the CEX do not match.");
    pAVar3 = (Abc_Cex_t *)0x0;
  }
  return pAVar3;
}

Assistant:

Abc_Cex_t * Saig_PhaseTranslateCex( Aig_Man_t * p, Abc_Cex_t * pCex )
{
    Abc_Cex_t * pNew;
    int i, k, iFrame, nFrames;
    // make sure the PI count of the AIG is a multiple of the PI count of the CEX
    // if this is not true, the CEX is not derived as the result of unrolling of pAig
    // or the unrolled CEX went through transformations that change the PI count
    if ( pCex->nPis % Saig_ManPiNum(p) != 0 )
    {
        printf( "The PI count in the AIG and in the CEX do not match.\n" );
        return NULL;
    }
    // get the number of unrolled frames
    nFrames = pCex->nPis / Saig_ManPiNum(p);
    // get the frame where it fails
    iFrame = pCex->iFrame * nFrames + pCex->iPo / Saig_ManPoNum(p);
    // start a new CEX (assigns: p->nRegs, p->nPis, p->nBits)
    pNew = Abc_CexAlloc( Saig_ManRegNum(p), Saig_ManPiNum(p), iFrame+1 );
    assert( pNew->nBits == pNew->nPis * (iFrame + 1) + pNew->nRegs );
    // now assign the failed frame and the failed PO (p->iFrame and p->iPo)
    pNew->iFrame = iFrame;
    pNew->iPo    = pCex->iPo % Saig_ManPoNum(p);
    // copy the bit data
    for ( i = pCex->nRegs, k = pNew->nRegs; k < pNew->nBits; k++, i++ )
        if ( Abc_InfoHasBit( pCex->pData, i ) )
            Abc_InfoSetBit( pNew->pData, k );
    assert( i <= pCex->nBits );
    return pNew;
}